

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O2

bool WriteDSK(FILE *f_,shared_ptr<Disk> *disk)

{
  pointer __src;
  byte bVar1;
  uint3 uVar5;
  byte bVar6;
  bool bVar7;
  FILE *pFVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint8_t *__ptr;
  Track *this;
  Sector *pSVar19;
  char *pcVar20;
  Data *pDVar21;
  size_t sVar22;
  exception *peVar23;
  uint8_t uVar24;
  uint uVar25;
  uint head_;
  DataRate datarate;
  uint8_t *puVar26;
  ulong uVar27;
  ulong __n;
  byte bVar28;
  ushort uVar29;
  uint local_284;
  uint local_280;
  uint local_27c;
  ulong local_278;
  int local_26c;
  uint8_t *local_268;
  ulong local_260;
  Header local_258;
  FILE *local_248;
  uint8_t *local_240;
  ulong local_238;
  ulong local_230;
  uint local_228;
  uint local_224;
  CylHead cylhead;
  MEMORY mem;
  undefined1 *local_200;
  vector<unsigned_short,_std::allocator<unsigned_short>_> offsets;
  Sector sector;
  Sector typical;
  char local_138 [48];
  byte local_108;
  byte local_107;
  undefined1 local_104 [212];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
  mem.size = 0xff00;
  local_248 = (FILE *)f_;
  __ptr = AllocMem(0xff00);
  mem.pb = __ptr;
  memset(local_138 + 0x22,0,0xde);
  builtin_strncpy(local_138,"EXTENDED CPC DSK File\r\nDisk-Info\r\n",0x22);
  util::fmt_abi_cxx11_((string *)&typical,"SAMdisk%02u%02u%02u",0x19,4);
  strncpy(local_138 + 0x22,
          (char *)CONCAT17(typical.header.head._3_1_,
                           CONCAT52(typical.header._2_5_,(undefined2)typical.header.cyl)),0xe);
  std::__cxx11::string::~string((string *)&typical);
  iVar13 = Disk::cyls((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_108 = (byte)iVar13;
  uVar14 = Disk::heads((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_107 = (byte)uVar14;
  if ((ulong)local_108 < 0x67) {
    if ((uVar14 & 0xff) < 3) {
      offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                (&offsets,(ulong)(uVar14 & 0xff) * ((ulong)local_108 + 1));
      local_200 = local_104;
      fseek(local_248,0x100,0);
      bVar6 = 1;
      uVar14 = 0;
      do {
        pFVar8 = local_248;
        if (local_108 <= uVar14) {
          if ((bool)(bVar6 & opt.legacy == 0)) {
            typical.header.sector = 0xd6f666e;
            typical.header.size = CONCAT13(typical.header.size._3_1_,10);
            typical.header.cyl._0_2_ = 0x664f;
            typical.header._2_5_ = 0x2d74657366;
            typical.header.head._3_1_ = 0x49;
            fwrite(&typical,0xf,1,local_248);
            fwrite(offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 1,2,pFVar8);
          }
          pFVar8 = local_248;
          fseek(local_248,0,0);
          sVar22 = fwrite(local_138,0x100,1,pFVar8);
          if (sVar22 == 0) {
            peVar23 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[12]>(peVar23,(char (*) [12])"write error");
            __cxa_throw(peVar23,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          fseek(pFVar8,0,2);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
          MEMORY::~MEMORY(&mem);
          return true;
        }
        for (head_ = 0; head_ < local_107; head_ = head_ + 1) {
          CylHead::CylHead(&cylhead,uVar14,head_);
          this = Disk::read_track((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr,&cylhead,false);
          bVar9 = Track::is_mixed_encoding(this);
          if (bVar9) {
            peVar23 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<CylHead&,char_const(&)[46]>
                      (peVar23,&cylhead,
                       (char (*) [46])" is mixed-density, which EDSK doesn\'t support");
            __cxa_throw(peVar23,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          typical.header.cyl._0_2_ = (undefined2)(this->tracklen / 0x10);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (&offsets,(unsigned_short *)&typical);
          local_268 = mem.pb;
          local_258.cyl = 0;
          local_258.head = 0;
          local_258.sector = 0;
          local_258.size = 0;
          Sector::Sector(&sector,Unknown,Unknown,&local_258,0);
          GetTypicalSector(&typical,&cylhead,this,&sector);
          std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
          iVar13 = Track::size(this);
          uVar15 = iVar13 * 8 + 0x117U & 0xffffff00;
          local_228 = uVar15;
          memset(mem.pb,0,(long)(int)uVar15);
          local_268[0] = 'T';
          local_268[1] = 'r';
          local_268[2] = 'a';
          local_268[3] = 'c';
          local_268[4] = 'k';
          local_268[5] = '-';
          local_268[6] = 'I';
          local_268[7] = 'n';
          local_268[5] = '-';
          local_268[6] = 'I';
          local_268[7] = 'n';
          local_268[8] = 'f';
          local_268[9] = 'o';
          local_268[10] = '\r';
          local_268[0xb] = '\n';
          local_268[0xc] = '\0';
          local_268[0x10] = (uint8_t)uVar14;
          local_268[0x11] = (uint8_t)head_;
          iVar13 = Track::size(this);
          local_268[0x15] = (uint8_t)iVar13;
          local_268[0x17] = 0xe5;
          iVar13 = Track::size(this);
          uVar24 = '\x02';
          if (iVar13 != 0) {
            uVar24 = (uint8_t)typical.header.size;
          }
          local_268[0x14] = uVar24;
          uVar24 = (uint8_t)typical.gap3;
          if (typical.gap3 == 0) {
            uVar24 = 'N';
          }
          local_268[0x16] = uVar24;
          iVar13 = Track::size(this);
          if (iVar13 == 0) {
            datarate = Unknown;
          }
          else {
            pSVar19 = Track::operator[](this,0);
            datarate = pSVar19->datarate;
          }
          iVar13 = Track::size(this);
          if (iVar13 == 0) {
            bVar9 = false;
          }
          else {
            pSVar19 = Track::operator[](this,0);
            bVar9 = pSVar19->encoding == FM;
          }
          if ((datarate == _250K) || (datarate == _300K)) {
            uVar24 = '\x01';
          }
          else if (datarate == _500K) {
            uVar24 = '\x02';
          }
          else if (datarate == _1M) {
            uVar24 = '\x03';
          }
          else {
            uVar24 = '\0';
          }
          local_268[0x12] = uVar24;
          local_268[0x13] = bVar9;
          iVar13 = opt.legacy;
          iVar16 = GetUnformatSizeCode(datarate);
          local_280 = Sector::SizeCodeToLength(iVar16);
          local_278 = 0;
          local_260 = 0;
          local_230 = 0;
          local_238 = 0;
          bVar9 = iVar13 != 0;
          while (bVar7 = bVar9, iVar13 = Track::size(this), iVar13 != 0) {
            local_240 = mem.pb + (int)uVar15;
            local_278 = (ulong)local_228;
            puVar26 = local_268;
            local_284 = uVar15;
            for (uVar27 = 0; uVar27 < puVar26[0x15]; uVar27 = uVar27 + 1) {
              pSVar19 = Track::operator[](this,(int)uVar27);
              Sector::Sector(&sector,pSVar19);
              if (sector.offset != 0 && (local_260 & 1) == 0) {
                local_258.cyl._0_2_ = (short)(sector.offset / 0x10);
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                emplace_back<unsigned_short>(&offsets,(unsigned_short *)&local_258);
              }
              else {
                bVar6 = bVar6 & sector.offset != 0;
              }
              iVar13 = 200000;
              if (sector.datarate == _300K) {
                iVar13 = 0x28b0b;
              }
              iVar13 = GetTrackCapacity(iVar13,sector.datarate,sector.encoding);
              if ((sector.dam != 0xf8) && (sector.dam != 0xfb)) {
                pcVar20 = CHR(uVar14,head_,sector.header.sector);
                local_258._0_8_ = pcVar20;
                Message<char_const*,unsigned_char&>
                          (msgWarning,"discarding data from %s due to non-standard DAM %02x",
                           (char **)&local_258,&sector.dam);
                Sector::remove_data(&sector);
              }
              bVar9 = Sector::has_badidcrc(&sector);
              bVar10 = Sector::has_badidcrc(&sector);
              if (bVar10) {
                bVar10 = false;
              }
              else {
                bVar10 = Sector::has_data(&sector);
                bVar10 = !bVar10;
              }
              bVar11 = Sector::has_baddatacrc(&sector);
              bVar12 = Sector::is_deleted(&sector);
              local_26c = CONCAT31(local_26c._1_3_,bVar11);
              bVar28 = bVar10 | 0x20;
              if (!bVar11) {
                bVar28 = bVar10;
              }
              bVar1 = bVar28 + 0x40;
              if (!bVar12) {
                bVar1 = bVar28;
              }
              local_224 = (uint)bVar1;
              iVar16 = Sector::copies(&sector);
              uVar17 = Sector::data_size(&sector);
              local_27c = Sector::size(&sector);
              uVar25 = local_280;
              if ((int)uVar17 < (int)local_280) {
                uVar25 = uVar17;
              }
              if (sector.header.size < 8) {
                uVar25 = uVar17;
              }
              uVar17 = uVar25;
              if ((iVar16 < 2) ||
                 (bVar10 = Track::is_8k_sector(this), uVar17 = local_27c,
                 bVar10 || uVar25 == local_27c)) {
                if (iVar13 < (int)uVar17) {
                  bVar10 = Track::is_8k_sector(this);
                  if (!bVar10) {
                    iVar16 = 1;
                  }
                }
              }
              else if ((int)local_27c < (int)uVar25) {
                pcVar20 = CHR(uVar14,head_,sector.header.sector);
                local_258._0_8_ = pcVar20;
                Message<char_const*>
                          (msgWarning,"discarding gaps from multiple copies of %s",
                           (char **)&local_258);
              }
              else if ((sector.offset != 0) && ((int)(sector.offset + local_27c) < this->tracklen))
              {
                pcVar20 = CHR(uVar14,head_,sector.header.sector);
                local_258._0_8_ = pcVar20;
                Message<char_const*>
                          (msgWarning,"short data field in multiple copies of %s",
                           (char **)&local_258);
              }
              if ((local_230 & 1) != 0) {
                bVar10 = Sector::has_baddatacrc(&sector);
                iVar13 = 1;
                if (iVar16 < 1) {
                  iVar13 = iVar16;
                }
                if (bVar10) {
                  iVar16 = iVar13;
                }
              }
              if ((local_238 & 1) != 0) {
                bVar10 = Sector::has_baddatacrc(&sector);
                uVar25 = local_280;
                if ((int)uVar17 < (int)local_280) {
                  uVar25 = uVar17;
                }
                if (bVar10) {
                  uVar17 = uVar25;
                }
              }
              if (bVar7) {
                if (0 < iVar16) {
                  iVar16 = 1;
                }
                uVar25 = 0x1800;
                if ((int)uVar17 < 0x1800) {
                  uVar25 = uVar17;
                }
                if (sector.header.size != 6) {
                  uVar25 = uVar17;
                }
                if (6 < sector.header.size) {
                  uVar25 = 0;
                }
                uVar17 = uVar25;
                if ((int)local_27c <= (int)uVar25) {
                  uVar17 = local_27c;
                }
              }
              bVar28 = bVar9 | (byte)local_26c;
              iVar13 = 0;
              local_26c = 0;
              if (0 < iVar16) {
                local_26c = iVar16;
              }
              for (; puVar26 = local_268, local_26c != iVar13; iVar13 = iVar13 + 1) {
                pDVar21 = Sector::data_copy(&sector,iVar13);
                puVar26 = local_240;
                if ((int)((int)local_278 + uVar17) < mem.size) {
                  __src = (pDVar21->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                  iVar18 = (int)(pDVar21->
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (int)__src;
                  __n = (ulong)(int)uVar17;
                  if (iVar18 < (int)uVar17) {
                    local_278 = __n;
                    memcpy(local_240,__src,(long)iVar18);
                    __n = local_278;
                    iVar18 = (int)(pDVar21->
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                             (int)(pDVar21->
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                    memset(puVar26 + iVar18,0,(long)(int)(uVar17 - iVar18));
                  }
                  else {
                    memcpy(local_240,__src,__n);
                  }
                  if (uVar17 == 0) {
                    uVar17 = 0;
                  }
                  else {
                    iVar18 = Sector::copies(&sector);
                    if (((iVar18 == 1) &&
                        (bVar9 = Sector::has_baddatacrc(&sector), bVar9 && uVar17 != local_27c)) &&
                       ((int)uVar17 % (int)local_27c == 0)) {
                      uVar17 = uVar17 + 1;
                      local_240[__n] = '{';
                    }
                  }
                }
                local_240 = local_240 + (int)uVar17;
                local_284 = uVar17 + local_284;
                local_278 = (ulong)local_284;
              }
              uVar29 = (ushort)sector.header.head & 0xff;
              bVar1 = ((sector.header.cyl & 0xffU) != 0) *
                      (((ushort)sector.header.cyl & 0xff) < 0x100) * (char)sector.header.cyl -
                      (0xff < ((ushort)sector.header.cyl & 0xff));
              bVar2 = (uVar29 != 0) * (uVar29 < 0x100) * (char)(ushort)sector.header.head -
                      (0xff < uVar29);
              bVar3 = ((sector.header.sector & 0xffU) != 0) *
                      (((ushort)sector.header.sector & 0xff) < 0x100) * (char)sector.header.sector -
                      (0xff < ((ushort)sector.header.sector & 0xff));
              bVar4 = ((sector.header.size & 0xffU) != 0) *
                      (((ushort)sector.header.size & 0xff) < 0x100) * (char)sector.header.size -
                      (0xff < ((ushort)sector.header.size & 0xff));
              *(uint *)(local_268 + uVar27 * 8 + 0x18) =
                   CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                            CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                     CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 -
                                              (0xff < bVar2),
                                              (bVar1 != 0) * (bVar1 < 0x100) * bVar1 -
                                              (0xff < bVar1))));
              local_268[uVar27 * 8 + 0x1c] = bVar28 << 5;
              local_268[uVar27 * 8 + 0x1d] = (uint8_t)local_224;
              local_268[uVar27 * 8 + 0x1e] = (uint8_t)(uVar17 * iVar16);
              local_268[uVar27 * 8 + 0x1f] = (uint8_t)(uVar17 * iVar16 >> 8);
              std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
            }
            iVar13 = (int)local_278;
            if ((int)local_278 <= mem.size) {
              memset(mem.pb + (int)local_278,0,(long)(mem.size - (int)local_278));
              goto LAB_0018ea86;
            }
            uVar5 = (uint3)((uint)(mem.size - (int)local_278) >> 8);
            bVar9 = bVar7;
            if ((local_230 & 1) == 0) {
              local_260 = CONCAT71((uint7)uVar5,1);
              local_230 = (ulong)CONCAT31(uVar5,1);
            }
            else if ((local_238 & 1) == 0) {
              local_260 = CONCAT71((uint7)uVar5,1);
              local_238 = (ulong)CONCAT31(uVar5,1);
            }
            else {
              uVar5 = (uint3)(local_280 >> 8);
              if ((int)local_280 < 0x81) {
                local_260 = CONCAT71((uint7)uVar5,1);
                bVar9 = true;
                if (bVar7) {
                  peVar23 = (exception *)__cxa_allocate_exception(0x10);
                  sector.header.cyl = 0xff00;
                  util::exception::
                  exception<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
                            (peVar23,&cylhead,(char (*) [8])0x1adc0d,(int *)&local_284,
                             (char (*) [29])") exceeds EDSK track limit (",(int *)&sector,
                             (char (*) [2])0x1a9e10);
                  __cxa_throw(peVar23,&util::exception::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
              }
              else {
                local_280 = local_280 >> 1;
                local_260 = CONCAT71((uint7)(uVar5 >> 1),1);
              }
            }
          }
          iVar13 = (int)local_278;
LAB_0018ea86:
          local_284 = iVar13 + 0xffU & 0xffffff00;
          *local_200 = (char)(iVar13 + 0xffU >> 8);
          local_200 = local_200 + 1;
          fwrite(__ptr,(long)(int)local_284,1,local_248);
          std::vector<Data,_std::allocator<Data>_>::~vector(&typical.m_data);
        }
        uVar14 = uVar14 + 1;
      } while( true );
    }
    peVar23 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[24]>(peVar23,(char (*) [24])"too many heads for EDSK");
  }
  else {
    peVar23 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[28]>
              (peVar23,(char (*) [28])"too many cylinders for EDSK");
  }
  __cxa_throw(peVar23,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool WriteDSK(FILE* f_, std::shared_ptr<Disk>& disk)
{
    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    auto pbTrack = mem.pb;

    uint8_t abHeader[256] = {}; // EDSK file header is fixed at 256 bytes - don't change!
    auto peh = reinterpret_cast<EDSK_HEADER*>(abHeader);
    auto pbIndex = reinterpret_cast<uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(abHeader) - sizeof(EDSK_HEADER)) / MAX_SIDES;

    memcpy(peh->szSignature, EDSK_SIGNATURE, sizeof(EDSK_SIGNATURE) - 1);
    strncpy(peh->szCreator, util::fmt("SAMdisk%02u%02u%02u", YEAR % 100, MONTH + 1, DAY).c_str(), sizeof(peh->szCreator));

    peh->bTracks = static_cast<uint8_t>(disk->cyls());
    peh->bSides = static_cast<uint8_t>(disk->heads());

    if (peh->bTracks > max_cyls)
        throw util::exception("too many cylinders for EDSK");
    else if (peh->bSides > MAX_SIDES)
        throw util::exception("too many heads for EDSK");

    bool add_offsets_block = true;
    std::vector<uint16_t> offsets;
    offsets.reserve((peh->bTracks + 1) * peh->bSides);

    fseek(f_, sizeof(abHeader), SEEK_SET);

    for (uint8_t cyl = 0; cyl < peh->bTracks; ++cyl)
    {
        for (uint8_t head = 0; head < peh->bSides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto& track = disk->read_track(cylhead);

            if (track.is_mixed_encoding())
                throw util::exception(cylhead, " is mixed-density, which EDSK doesn't support");

            bool added_sector_offsets = false;
            offsets.push_back(util::htole(static_cast<uint16_t>(track.tracklen / 16)));

            auto pt = reinterpret_cast<EDSK_TRACK*>(mem.pb);
            auto ps = reinterpret_cast<EDSK_SECTOR*>(pt + 1);

            Sector typical = GetTypicalSector(cylhead, track, Sector(DataRate::Unknown, Encoding::Unknown));

            // The standard track header is 256 bytes, but to allow more than 29 sectors we'll
            // round up the required size to the next 256-byte boundary
            int track_header_size = (sizeof(EDSK_TRACK) + track.size() * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;

            memset(mem, 0, track_header_size);
            memcpy(pt->signature, EDSK_TRACK_SIG, sizeof(pt->signature));
            pt->track = cyl;
            pt->side = head;
            pt->sectors = static_cast<uint8_t>(track.size());
            pt->fill = 0xe5;
            pt->size = static_cast<uint8_t>(track.size() ? typical.header.size : EDSK_DEFAULT_SIZE);
            pt->gap3 = static_cast<uint8_t>(typical.gap3 ? typical.gap3 : EDSK_DEFAULT_GAP3);

            auto datarate = track.size() ? track[0].datarate : DataRate::Unknown;
            auto encoding = track.size() ? track[0].encoding : Encoding::Unknown;

            switch (datarate)
            {
            default:                pt->rate = 0;   break;
            case DataRate::_250K:   pt->rate = 1;   break;
            case DataRate::_300K:   pt->rate = 1;   break;
            case DataRate::_500K:   pt->rate = 2;   break;
            case DataRate::_1M:     pt->rate = 3;   break;
            }

            pt->encoding = (encoding == Encoding::FM) ? 1 : 0;

            // Assume 300rpm to determine approximate track capacity
            auto track_size = 0;

            // Space saving flags, to squeeze the track into the limited EDSK space
            bool fFitLegacy = !!opt.legacy;
            bool fFitErrorCopies = false, fFitErrorSize = false;
            auto uFitSize = Sector::SizeCodeToLength(GetUnformatSizeCode(datarate));

            // Loop to fit any sectors
            while (track.size())
            {
                // Start with the size of the track header
                track_size = track_header_size;

                // Point to the start of the data area and the sector space
                auto pb = mem + track_header_size;

                for (int i = 0; i < pt->sectors; ++i)
                {
                    auto sector = track[i];

                    // If any offsets are zero we can't generate append an offsets block.
                    if (!sector.offset)
                        add_offsets_block = false;
                    // Take care to only output offsets on the first pass around the fitting loop.
                    else if (!added_sector_offsets)
                        offsets.push_back(util::htole(static_cast<uint16_t>(sector.offset / 16)));

                    auto rpm_time = (sector.datarate == DataRate::_300K) ? RPM_TIME_360 : RPM_TIME_300;
                    auto track_capacity = GetTrackCapacity(rpm_time, sector.datarate, sector.encoding);

                    // Accept only normal and deleted DAMs, removing the data field for other types.
                    // Hercule II (CPC) has a non-standard DAM (0xFD), and expects it to be unreadable.
                    if (sector.dam != 0xfb && sector.dam != 0xf8)
                    {
                        Message(msgWarning, "discarding data from %s due to non-standard DAM %02x",
                            CHR(cyl, head, sector.header.sector), sector.dam);
                        sector.remove_data();
                    }

                    uint8_t status1 = 0, status2 = 0;
                    if (sector.has_badidcrc()) status1 |= SR1_CRC_ERROR;
                    if (!sector.has_badidcrc() && !sector.has_data()) status2 |= SR2_MISSING_ADDRESS_MARK;
                    if (sector.has_baddatacrc()) { status1 |= SR1_CRC_ERROR; status2 |= SR2_CRC_ERROR_IN_SECTOR_DATA; }
                    if (sector.is_deleted()) status2 |= SR2_SECTOR_WITH_DELETED_DATA;

                    auto num_copies = sector.copies();
                    auto data_size = sector.data_size();
                    auto real_size = sector.size();

                    // Clip extended sizes to the unformat size, to ensure we have a complete revolution
                    if (sector.header.size > 7 && data_size > uFitSize)
                        data_size = uFitSize;

                    // Preserve multiple copies on 8K tracks by extending them to full size
                    if (num_copies > 1 && track.is_8k_sector())
                        data_size = real_size;

                    // Warn if other error sectors are shorter than real size
                    if (num_copies > 1 && data_size != real_size)
                    {
                        if (data_size > real_size)
                            Message(msgWarning, "discarding gaps from multiple copies of %s", CHR(cyl, head, sector.header.sector));
                        else if (sector.offset && sector.offset + real_size < track.tracklen)
                            Message(msgWarning, "short data field in multiple copies of %s", CHR(cyl, head, sector.header.sector));

                        data_size = real_size;
                    }

                    // Drop extra copies on sectors larger than the track, unless it's
                    // an 8K sector with an error during the first 6K of data.
                    else if (data_size > track_capacity && !track.is_8k_sector())
                        num_copies = 1;

                    // Drop any extra copies of error sectors
                    if (fFitErrorCopies)
                    {
                        if (sector.has_baddatacrc() && num_copies > 1)
                            num_copies = 1;
                    }

                    // Cut extended sectors down to zero data
                    if (fFitErrorSize)
                    {
                        if (sector.has_baddatacrc() && data_size > uFitSize)
                            data_size = uFitSize;
                    }

                    // Force to legacy format?
                    if (fFitLegacy)
                    {
                        if (num_copies > 1) num_copies = 1;
                        if (sector.header.size == 6 && data_size > 6144) data_size = 6144;
                        if (sector.header.size >= 7) data_size = 0;
                        if (data_size > real_size) data_size = real_size;
                    }

                    // Copy the sector data into place
                    for (auto copy = 0; copy < num_copies; ++copy)
                    {
                        const Data& data = sector.data_copy(copy);

                        // Only copy if there's room - we'll check it fits later
                        if (track_size + data_size < mem.size)
                        {
                            if (data.size() >= data_size)
                                memcpy(pb, data.data(), data_size);
                            else
                            {
                                // Extend 8K sectors to full size to preserve multiple copies
                                memcpy(pb, data.data(), data.size());
                                memset(pb + data.size(), 0, data_size - data.size());
                            }

                            // Single copy data CRC error and size that conflicts with multiple copies extension?
                            if (data_size && sector.copies() == 1 && sector.has_baddatacrc() &&
                                data_size != real_size && (data_size % real_size) == 0)
                            {
                                // Write a dummy marker byte to the end of the data, and increment the stored size
                                pb[data_size++] = 123;
                            }
                        }

                        pb += data_size;
                        track_size += data_size;
                    }

                    ps[i].track = static_cast<uint8_t>(sector.header.cyl);
                    ps[i].side = static_cast<uint8_t>(sector.header.head);
                    ps[i].sector = static_cast<uint8_t>(sector.header.sector);
                    ps[i].size = static_cast<uint8_t>(sector.header.size);
                    ps[i].status1 = status1;
                    ps[i].status2 = status2;

                    data_size *= num_copies;
                    ps[i].datalow = data_size & 0xff;
                    ps[i].datahigh = static_cast<uint8_t>(data_size >> 8);
                }

                // If the track fits, we're done
                if (track_size <= mem.size)
                {
                    // Clear any unused space, then break out to save it
                    memset(mem + track_size, 0, mem.size - track_size);
                    break;
                }

                // Flag that sector offsets have already been generated.
                added_sector_offsets = true;

                // Try again using various techniques to make it fit
                if (!fFitErrorCopies) { fFitErrorCopies = true; continue; }
                if (!fFitErrorSize) { fFitErrorSize = true; continue; }
                if (uFitSize > 128) { uFitSize /= 2; continue; }
                if (!fFitLegacy) { fFitLegacy = true; continue; }

                // If we run out of methods, fail
                throw util::exception(cylhead, " size (", track_size, ") exceeds EDSK track limit (", ESDK_MAX_TRACK_SIZE, ")");
            }

            // Round the size up to the next 256-byte boundary, and store the MSB in the index
            track_size = (track_size + 0xff) & ~0xff;
            *pbIndex++ = static_cast<uint8_t>(track_size >> 8);

            // Write the track to the image
            fwrite(pbTrack, track_size, 1, f_);
        }
    }

    // Add offsets if available, unless they're disabled
    if (!opt.legacy && add_offsets_block)
    {
        EDSK_OFFSETS eo = { EDSK_OFFSETS_SIG, 0 };
        fwrite(&eo, sizeof(eo), 1, f_);
        fwrite(offsets.data(), offsets.size(), sizeof(uint16_t), f_);
    }

    fseek(f_, 0, SEEK_SET);
    if (!fwrite(abHeader, sizeof(abHeader), 1, f_))
        throw util::exception("write error");
    fseek(f_, 0, SEEK_END);

    return true;
}